

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestPackage.cpp
# Opt level: O1

TestPackageRegistry * tcu::TestPackageRegistry::getOrDestroy(bool isCreate)

{
  TestPackageRegistry *pTVar1;
  undefined7 in_register_00000039;
  
  pTVar1 = getOrDestroy::s_ptr;
  if ((int)CONCAT71(in_register_00000039,isCreate) == 0) {
    if (getOrDestroy::s_ptr != (TestPackageRegistry *)0x0) {
      ~TestPackageRegistry(getOrDestroy::s_ptr);
      operator_delete(pTVar1,0x18);
      getOrDestroy::s_ptr = (TestPackageRegistry *)0x0;
    }
    pTVar1 = (TestPackageRegistry *)0x0;
  }
  else if (getOrDestroy::s_ptr == (TestPackageRegistry *)0x0) {
    pTVar1 = (TestPackageRegistry *)operator_new(0x18);
    (pTVar1->m_packageInfos).
    super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pTVar1->m_packageInfos).
    super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pTVar1->m_packageInfos).
    super__Vector_base<tcu::TestPackageRegistry::PackageInfo_*,_std::allocator<tcu::TestPackageRegistry::PackageInfo_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    getOrDestroy::s_ptr = pTVar1;
  }
  return pTVar1;
}

Assistant:

TestPackageRegistry* TestPackageRegistry::getOrDestroy (bool isCreate)
{
	static TestPackageRegistry* s_ptr = DE_NULL;

	if (isCreate)
	{
		if (!s_ptr)
			s_ptr = new TestPackageRegistry();

		return s_ptr;
	}
	else
	{
		if (s_ptr)
		{
			delete s_ptr;
			s_ptr = DE_NULL;
		}

		return DE_NULL;
	}
}